

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::PhpNamePrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view classname)

{
  bool bVar1;
  allocator<char> *__a;
  char *__s;
  string_view name;
  allocator<char> local_a;
  allocator<char> local_9;
  
  name._M_str = (char *)classname._M_len;
  name._M_len = (size_t)this;
  bVar1 = IsReservedName(name);
  if (bVar1) {
    __s = "PB";
    __a = &local_9;
  }
  else {
    __s = "";
    __a = &local_a;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string PhpNamePrefix(absl::string_view classname) {
  if (IsReservedName(classname)) return "PB";
  return "";
}